

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymSim.c
# Opt level: O2

void Sim_SymmsSimulate(Sym_Man_t *p,uint *pPat,Vec_Ptr_t *vMatrsNonSym)

{
  uint *puVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Int_t *p_00;
  int iVar3;
  int iVar4;
  void *pvVar5;
  abctime aVar6;
  Abc_Obj_t *pNode;
  abctime aVar7;
  long *plVar8;
  Extra_BitMat_t *p_01;
  void *pvVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int i_00;
  int i;
  uint uVar13;
  
  for (uVar13 = 0; pVVar2 = p->pNtk->vCis, (int)uVar13 < pVVar2->nSize; uVar13 = uVar13 + 1) {
    pvVar5 = Vec_PtrEntry(pVVar2,uVar13);
    pvVar5 = Vec_PtrEntry(p->vSim,*(int *)((long)pvVar5 + 0x10));
    lVar11 = 0;
    if ((pPat[uVar13 >> 5] >> (uVar13 & 0x1f) & 1) == 0) {
      for (; lVar11 < p->nSimWords; lVar11 = lVar11 + 1) {
        *(undefined4 *)((long)pvVar5 + lVar11 * 4) = 0;
      }
    }
    else {
      for (; lVar11 < p->nSimWords; lVar11 = lVar11 + 1) {
        *(undefined4 *)((long)pvVar5 + lVar11 * 4) = 0xffffffff;
      }
    }
    puVar1 = (uint *)((long)pvVar5 + (ulong)(uVar13 >> 5) * 4);
    *puVar1 = *puVar1 ^ 1 << ((byte)uVar13 & 0x1f);
  }
  aVar6 = Abc_Clock();
  for (iVar12 = 0; iVar12 < p->vNodes->nSize; iVar12 = iVar12 + 1) {
    pNode = (Abc_Obj_t *)Vec_PtrEntry(p->vNodes,iVar12);
    Sim_UtilSimulateNodeOne(pNode,p->vSim,p->nSimWords,0);
  }
  aVar7 = Abc_Clock();
  p->timeSim = p->timeSim + (aVar7 - aVar6);
  lVar11 = 0;
  aVar6 = Abc_Clock();
  while( true ) {
    pVVar2 = p->pNtk->vCos;
    if (pVVar2->nSize <= lVar11) {
      aVar7 = Abc_Clock();
      p->timeMatr = p->timeMatr + (aVar7 - aVar6);
      return;
    }
    i_00 = (int)lVar11;
    plVar8 = (long *)Vec_PtrEntry(pVVar2,i_00);
    lVar10 = *(long *)(*(long *)(*(long *)(*plVar8 + 0x20) + 8) + (long)*(int *)plVar8[4] * 8);
    iVar12 = Vec_IntEntry(p->vPairsTotal,i_00);
    iVar3 = Vec_IntEntry(p->vPairsSym,i_00);
    iVar4 = Vec_IntEntry(p->vPairsNonSym,i_00);
    if (iVar12 < iVar4 + iVar3) break;
    if (iVar12 != iVar4 + iVar3) {
      p_01 = (Extra_BitMat_t *)Vec_PtrEntry(vMatrsNonSym,i_00);
      if (p->vSupports->nSize <= lVar11) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                      ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
      }
      p_00 = (Vec_Int_t *)p->vSupports->pArray[lVar11];
      pvVar5 = Vec_PtrEntry(p->vSuppFun,i_00);
      pvVar9 = Vec_PtrEntry(p->vSim,*(int *)(lVar10 + 0x10));
      for (lVar10 = 0; lVar10 < p->nSimWords; lVar10 = lVar10 + 1) {
        p->uPatCol[lVar10] =
             pPat[lVar10] & *(uint *)((long)pvVar5 + lVar10 * 4) &
             *(uint *)((long)pvVar9 + lVar10 * 4);
        p->uPatRow[lVar10] =
             ~*(uint *)((long)pvVar9 + lVar10 * 4) &
             pPat[lVar10] & *(uint *)((long)pvVar5 + lVar10 * 4);
      }
      for (iVar12 = 0; iVar3 = p_00->nSize, iVar12 < iVar3; iVar12 = iVar12 + 1) {
        uVar13 = Vec_IntEntry(p_00,iVar12);
        if ((p->uPatCol[(int)uVar13 >> 5] >> (uVar13 & 0x1f) & 1) != 0) {
          Extra_BitMatrixOr(p_01,uVar13,p->uPatRow);
        }
      }
      for (iVar12 = 0; iVar12 < iVar3; iVar12 = iVar12 + 1) {
        uVar13 = Vec_IntEntry(p_00,iVar12);
        if ((p->uPatRow[(int)uVar13 >> 5] >> (uVar13 & 0x1f) & 1) != 0) {
          Extra_BitMatrixOr(p_01,uVar13,p->uPatCol);
        }
        iVar3 = p_00->nSize;
      }
      for (lVar10 = 0; lVar10 < p->nSimWords; lVar10 = lVar10 + 1) {
        p->uPatCol[lVar10] =
             ~pPat[lVar10] & *(uint *)((long)pvVar5 + lVar10 * 4) &
             *(uint *)((long)pvVar9 + lVar10 * 4);
        p->uPatRow[lVar10] =
             ~(*(uint *)((long)pvVar9 + lVar10 * 4) | pPat[lVar10]) &
             *(uint *)((long)pvVar5 + lVar10 * 4);
      }
      for (iVar12 = 0; iVar3 = p_00->nSize, iVar12 < iVar3; iVar12 = iVar12 + 1) {
        uVar13 = Vec_IntEntry(p_00,iVar12);
        if ((p->uPatCol[(int)uVar13 >> 5] >> (uVar13 & 0x1f) & 1) != 0) {
          Extra_BitMatrixOr(p_01,uVar13,p->uPatRow);
        }
      }
      for (iVar12 = 0; iVar12 < iVar3; iVar12 = iVar12 + 1) {
        uVar13 = Vec_IntEntry(p_00,iVar12);
        if ((p->uPatRow[(int)uVar13 >> 5] >> (uVar13 & 0x1f) & 1) != 0) {
          Extra_BitMatrixOr(p_01,uVar13,p->uPatCol);
        }
        iVar3 = p_00->nSize;
      }
    }
    lVar11 = lVar11 + 1;
  }
  __assert_fail("nPairsTotal >= nPairsSym + nPairsNonSym",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sim/simSymSim.c"
                ,0x4c,"void Sim_SymmsSimulate(Sym_Man_t *, unsigned int *, Vec_Ptr_t *)");
}

Assistant:

void Sim_SymmsSimulate( Sym_Man_t * p, unsigned * pPat, Vec_Ptr_t * vMatrsNonSym )
{
    Abc_Obj_t * pNode;
    int i, nPairsTotal, nPairsSym, nPairsNonSym;
    abctime clk;

    // create the simulation matrix
    Sim_SymmsCreateSquare( p, pPat );
    // simulate each node in the DFS order
clk = Abc_Clock();
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodes, pNode, i )
    {
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        Sim_UtilSimulateNodeOne( pNode, p->vSim, p->nSimWords, 0 );
    }
p->timeSim += Abc_Clock() - clk;
    // collect info into the CO matrices
clk = Abc_Clock();
    Abc_NtkForEachCo( p->pNtk, pNode, i )
    {
        pNode = Abc_ObjFanin0(pNode);
//        if ( Abc_ObjIsCi(pNode) || Abc_AigNodeIsConst(pNode) )
//            continue;
        nPairsTotal  = Vec_IntEntry(p->vPairsTotal, i);
        nPairsSym    = Vec_IntEntry(p->vPairsSym,   i);
        nPairsNonSym = Vec_IntEntry(p->vPairsNonSym,i);
        assert( nPairsTotal >= nPairsSym + nPairsNonSym ); 
        if ( nPairsTotal == nPairsSym + nPairsNonSym )
            continue;
        Sim_SymmsDeriveInfo( p, pPat, pNode, vMatrsNonSym, i );
    }
p->timeMatr += Abc_Clock() - clk;
}